

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

void __thiscall avro::NodeUnion::printJson(NodeUnion *this,ostream *os,int depth)

{
  const_reference pvVar1;
  size_type __n;
  ulong uVar2;
  size_type sVar3;
  
  std::operator<<(os,"[\n");
  uVar2 = (ulong)((long)(this->super_NodeImplUnion).leafAttributes_.attrs_.
                        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_NodeImplUnion).leafAttributes_.attrs_.
                       super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 4;
  __n = 0;
  sVar3 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    sVar3 = __n;
  }
  for (; sVar3 != __n; __n = __n + 1) {
    if (__n != 0) {
      std::operator<<(os,",\n");
    }
    operator<<(os,(indent)(depth + 1));
    pvVar1 = std::
             vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
             ::at(&(this->super_NodeImplUnion).leafAttributes_.attrs_,__n);
    (*pvVar1->px->_vptr_Node[0xd])(pvVar1->px,os,(ulong)(uint)(depth + 1));
  }
  std::operator<<(os,'\n');
  operator<<(os,(indent)depth);
  std::operator<<(os,']');
  return;
}

Assistant:

void 
NodeUnion::printJson(std::ostream &os, int depth) const
{
    os << "[\n";
    int fields = leafAttributes_.size();
    ++depth;
    for(int i = 0; i < fields; ++i) {
        if(i > 0) {
            os << ",\n";
        }
        os << indent(depth);
        leafAttributes_.get(i)->printJson(os, depth);
    }
    os << '\n';
    os << indent(--depth) << ']';
}